

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LessEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  double __val;
  double __val_00;
  double extraout_XMM0_Qa_00;
  double __val_01;
  double __val_02;
  double extraout_XMM0_Qa_01;
  double __val_03;
  double __val_04;
  double extraout_XMM0_Qa_02;
  double __val_05;
  double extraout_XMM0_Qa_03;
  double __val_06;
  Variable x;
  Variable y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  Variable local_130;
  Expression local_118;
  string local_100;
  string local_e0;
  Variable local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_130);
  Kandinsky::Variable::Variable(&local_c0);
  (local_130.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_c0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_118,&local_130,&local_c0);
  (**(local_118.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_130.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_100,__val);
  std::operator+(&local_190,"(",&local_100);
  std::operator+(&local_170,&local_190," < ");
  (**((local_c0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_e0,__val_00);
  std::operator+(&local_150,&local_170,&local_e0);
  std::operator+(&local_28,&local_150,") != 0");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa == 0.0) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_100);
  Kandinsky::Expression::~Expression(&local_118);
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_118,&local_c0,&local_130);
  (**(local_118.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_c0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_100,__val_01);
  std::operator+(&local_190,"(",&local_100);
  std::operator+(&local_170,&local_190," < ");
  (**((local_130.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_e0,__val_02);
  std::operator+(&local_150,&local_170,&local_e0);
  std::operator+(&local_48,&local_150,") != 1");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_00 == 1.0) & 1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_100);
  Kandinsky::Expression::~Expression(&local_118);
  (local_c0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_118,&local_130,&local_c0);
  (**(local_118.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_130.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_100,__val_03);
  std::operator+(&local_190,"(",&local_100);
  std::operator+(&local_170,&local_190," < ");
  (**((local_c0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_e0,__val_04);
  std::operator+(&local_150,&local_170,&local_e0);
  std::operator+(&local_68,&local_150,") != 0");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_01 == 0.0) & 1),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_100);
  Kandinsky::Expression::~Expression(&local_118);
  local_100._M_dataplus._M_p._0_4_ = 4;
  Kandinsky::operator<<Kandinsky::Variable,_int,_nullptr>
            ((Expression *)&local_190,&local_130,(int *)&local_100);
  (*(code *)**(undefined8 **)local_190._M_string_length)();
  (**((local_130.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_170,__val_05);
  std::operator+(&local_150,"(",&local_170);
  std::operator+(&local_88,&local_150," < 4) != 1");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_02 == 1.0) & 1),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  Kandinsky::Expression::~Expression((Expression *)&local_190);
  local_100._M_dataplus._M_p._0_4_ = 4;
  Kandinsky::operator<<int,_Kandinsky::Variable,_nullptr>
            ((Expression *)&local_190,(int *)&local_100,&local_130);
  (*(code *)**(undefined8 **)local_190._M_string_length)();
  (**((local_130.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_170,__val_06);
  std::operator+(&local_150,"(4 < ",&local_170);
  std::operator+(&local_a8,&local_150,") != 0");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_03 == 0.0) & 1),&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  Kandinsky::Expression::~Expression((Expression *)&local_190);
  Kandinsky::Variable::~Variable(&local_c0);
  Kandinsky::Variable::~Variable(&local_130);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x < y).evaluate() == 0, "(" + std::to_string(x.evaluate()) + " < " + std::to_string(y.evaluate()) + ") != 0");
    assertOrExit((y < x).evaluate() == 1, "(" + std::to_string(y.evaluate()) + " < " + std::to_string(x.evaluate()) + ") != 1");
    y.setValue(3);
    assertOrExit((x < y).evaluate() == 0, "(" + std::to_string(x.evaluate()) + " < " + std::to_string(y.evaluate()) + ") != 0");
    assertOrExit((x < 4).evaluate() == 1, "(" + std::to_string(x.evaluate()) + " < 4) != 1");
    assertOrExit((4 < x).evaluate() == 0, "(4 < " + std::to_string(x.evaluate()) + ") != 0");
    return 0;
}